

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O1

void jpeg_fdct_16x8(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  DCTELEM *pDVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  byte bVar23;
  byte bVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  int iVar118;
  uint uVar41;
  ulong uVar42;
  undefined1 auVar43 [16];
  ulong uVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  int iVar51;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  uint uVar52;
  int iVar56;
  uint uVar57;
  int iVar58;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  uint uVar61;
  uint uVar62;
  ulong uVar63;
  undefined1 auVar64 [16];
  ulong uVar66;
  undefined1 auVar65 [16];
  int iVar119;
  ulong uVar67;
  int iVar71;
  int iVar74;
  undefined1 auVar69 [16];
  ulong uVar68;
  ulong uVar72;
  ulong uVar73;
  undefined1 auVar70 [16];
  uint uVar75;
  ulong uVar76;
  int iVar78;
  undefined1 auVar77 [16];
  ulong uVar79;
  int iVar120;
  ulong uVar80;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  ulong uVar84;
  undefined1 auVar85 [16];
  undefined1 auVar87 [16];
  int iVar121;
  long lVar88;
  undefined1 auVar89 [16];
  uint uVar90;
  int iVar92;
  ulong uVar91;
  uint uVar93;
  ulong uVar94;
  ulong uVar95;
  undefined1 auVar96 [16];
  ulong uVar98;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  uint uVar103;
  ulong uVar104;
  int iVar106;
  uint uVar107;
  int iVar110;
  undefined1 auVar105 [16];
  ulong uVar109;
  uint uVar111;
  uint uVar112;
  int iVar114;
  int iVar115;
  uint uVar116;
  int iVar117;
  undefined1 auVar113 [16];
  undefined8 local_f8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_98;
  undefined8 local_88;
  ulong uVar83;
  ulong uVar86;
  ulong uVar97;
  ulong uVar101;
  ulong uVar102;
  ulong uVar108;
  
  uVar42 = (ulong)start_col;
  lVar31 = 0;
  do {
    lVar88 = *(long *)((long)sample_data + lVar31);
    bVar10 = *(byte *)(lVar88 + 0xf + uVar42);
    uVar66 = (ulong)((uint)*(byte *)(lVar88 + uVar42) + (uint)bVar10);
    bVar11 = *(byte *)(lVar88 + 1 + uVar42);
    bVar12 = *(byte *)(lVar88 + 0xe + uVar42);
    uVar67 = (ulong)((uint)bVar11 + (uint)bVar12);
    bVar13 = *(byte *)(lVar88 + 2 + uVar42);
    bVar14 = *(byte *)(lVar88 + 6 + uVar42);
    bVar15 = *(byte *)(lVar88 + 9 + uVar42);
    uVar63 = (ulong)((uint)bVar14 + (uint)bVar15);
    bVar16 = *(byte *)(lVar88 + 7 + uVar42);
    bVar17 = *(byte *)(lVar88 + 8 + uVar42);
    uVar44 = (ulong)((uint)bVar16 + (uint)bVar17);
    lVar28 = uVar44 + uVar66;
    lVar37 = uVar66 - uVar44;
    lVar40 = uVar67 + uVar63;
    lVar25 = uVar67 - uVar63;
    bVar18 = *(byte *)(lVar88 + 0xd + uVar42);
    uVar44 = (ulong)((uint)bVar13 + (uint)bVar18);
    bVar19 = *(byte *)(lVar88 + 5 + uVar42);
    bVar20 = *(byte *)(lVar88 + 10 + uVar42);
    uVar63 = (ulong)((uint)bVar19 + (uint)bVar20);
    lVar29 = uVar44 + uVar63;
    lVar32 = uVar44 - uVar63;
    bVar21 = *(byte *)(lVar88 + 3 + uVar42);
    bVar22 = *(byte *)(lVar88 + 0xc + uVar42);
    uVar63 = (ulong)((uint)bVar21 + (uint)bVar22);
    bVar23 = *(byte *)(lVar88 + 4 + uVar42);
    bVar24 = *(byte *)(lVar88 + 0xb + uVar42);
    uVar44 = (ulong)((uint)bVar23 + (uint)bVar24);
    lVar30 = uVar44 + uVar63;
    lVar39 = uVar63 - uVar44;
    lVar35 = (ulong)*(byte *)(lVar88 + uVar42) - (ulong)bVar10;
    lVar88 = (ulong)bVar11 - (ulong)bVar12;
    lVar36 = (ulong)bVar13 - (ulong)bVar18;
    lVar27 = (ulong)bVar21 - (ulong)bVar22;
    lVar26 = (ulong)bVar23 - (ulong)bVar24;
    lVar33 = (ulong)bVar19 - (ulong)bVar20;
    lVar38 = (ulong)bVar14 - (ulong)bVar15;
    lVar34 = (ulong)bVar16 - (ulong)bVar17;
    data[lVar31] = ((int)lVar28 + (int)lVar40 + (int)lVar29 + (int)lVar30) * 4 + -0x2000;
    data[lVar31 + 4] =
         (DCTELEM)((lVar40 - lVar29) * 0x1151 + (lVar28 - lVar30) * 0x29cf + 0x400U >> 0xb);
    lVar28 = (lVar37 - lVar32) * 0x2c63 + (lVar39 - lVar25) * 0x8d4;
    data[lVar31 + 2] = (DCTELEM)((ulong)(lVar32 * 0x4587 + lVar28 + 0x400 + lVar25 * 0x2e75) >> 0xb)
    ;
    data[lVar31 + 6] =
         (DCTELEM)((ulong)(lVar28 + lVar39 * 0x7ffffffde07 + 0x400 + lVar37 * 0x7fffffff93e) >> 0xb)
    ;
    lVar32 = (lVar38 - lVar34) * 0xd23 + (lVar88 + lVar35) * 0x2b4e;
    lVar29 = (lVar34 + lVar33) * 0x1555 + (lVar36 + lVar35) * 0x27e9;
    lVar25 = (lVar26 - lVar34) * 0x1cb6 + (lVar27 + lVar35) * 0x22fc;
    lVar37 = (lVar38 - lVar33) * 0x2d09 + (lVar36 + lVar88) * 0x470;
    lVar28 = (lVar38 + lVar26) * -0x27e9 + (lVar27 + lVar88) * -0x1555;
    lVar30 = (lVar33 - lVar26) * 0xd23 + (lVar27 + lVar36) * -0x2b4e;
    data[lVar31 + 1] =
         (DCTELEM)(lVar34 * 0x18f3 + lVar35 * 0x7ffffffb6d6 + lVar29 + lVar32 + lVar25 + 0x400U >>
                  0xb);
    data[lVar31 + 3] =
         (DCTELEM)(lVar32 + lVar37 + lVar38 * 0x7ffffffcac1 + lVar88 * 0x24d + lVar28 + 0x400U >>
                  0xb);
    data[lVar31 + 5] =
         (DCTELEM)((ulong)(lVar33 * 0x2747 + lVar37 + lVar36 * -0x2406 + lVar30 + 0x400 + lVar29) >>
                  0xb);
    data[lVar31 + 7] =
         (DCTELEM)((ulong)(lVar26 * 0x4560 + lVar28 + lVar30 + lVar27 * 0x2218 + 0x400 + lVar25) >>
                  0xb);
    lVar31 = lVar31 + 8;
  } while (lVar31 != 0x40);
  lVar31 = -8;
  do {
    piVar5 = data + lVar31 + 0x40;
    piVar1 = data + lVar31 + 8;
    piVar2 = data + lVar31 + 0x10;
    piVar3 = data + lVar31 + 0x18;
    piVar6 = data + lVar31 + 0x20;
    iVar119 = *piVar5 + *piVar1;
    auVar69._4_4_ = piVar5[1] + piVar1[1];
    iVar71 = piVar5[2] + piVar1[2];
    iVar74 = piVar5[3] + piVar1[3];
    auVar77._4_4_ = iVar74;
    auVar77._0_4_ = iVar71;
    auVar69._8_4_ = auVar69._4_4_;
    auVar69._12_4_ = -(uint)(auVar69._4_4_ < 0);
    lVar88 = CONCAT44(-(uint)(iVar119 < 0),iVar119);
    auVar77._8_4_ = iVar74;
    auVar77._12_4_ = -(uint)(iVar74 < 0);
    lVar25 = CONCAT44(-(uint)(iVar71 < 0),iVar71);
    piVar7 = data + lVar31 + 0x38;
    iVar118 = *piVar7 + *piVar2;
    auVar43._4_4_ = piVar7[1] + piVar2[1];
    iVar71 = piVar7[2] + piVar2[2];
    iVar74 = piVar7[3] + piVar2[3];
    auVar64._4_4_ = iVar74;
    auVar64._0_4_ = iVar71;
    auVar43._8_4_ = auVar43._4_4_;
    auVar43._12_4_ = -(uint)(auVar43._4_4_ < 0);
    lVar28 = CONCAT44(-(uint)(iVar118 < 0),iVar118);
    auVar64._8_4_ = iVar74;
    auVar64._12_4_ = -(uint)(iVar74 < 0);
    lVar30 = CONCAT44(-(uint)(iVar71 < 0),iVar71);
    piVar8 = data + lVar31 + 0x30;
    iVar120 = *piVar8 + *piVar3;
    auVar81._4_4_ = piVar8[1] + piVar3[1];
    iVar71 = piVar8[2] + piVar3[2];
    iVar74 = piVar8[3] + piVar3[3];
    auVar59._4_4_ = iVar74;
    auVar59._0_4_ = iVar71;
    auVar81._8_4_ = auVar81._4_4_;
    auVar81._12_4_ = -(uint)(auVar81._4_4_ < 0);
    lVar26 = CONCAT44(-(uint)(iVar120 < 0),iVar120);
    auVar59._8_4_ = iVar74;
    auVar59._12_4_ = -(uint)(iVar74 < 0);
    lVar29 = CONCAT44(-(uint)(iVar71 < 0),iVar71);
    piVar9 = data + lVar31 + 0x28;
    iVar121 = *piVar9 + *piVar6;
    auVar89._4_4_ = piVar9[1] + piVar6[1];
    iVar71 = piVar9[2] + piVar6[2];
    iVar74 = piVar9[3] + piVar6[3];
    auVar87._4_4_ = iVar74;
    auVar87._0_4_ = iVar71;
    auVar89._8_4_ = auVar89._4_4_;
    auVar89._12_4_ = -(uint)(auVar89._4_4_ < 0);
    lVar34 = CONCAT44(-(uint)(iVar121 < 0),iVar121);
    auVar87._8_4_ = iVar74;
    auVar87._12_4_ = -(uint)(iVar74 < 0);
    lVar33 = CONCAT44(-(uint)(iVar71 < 0),iVar71);
    lVar27 = lVar33 + lVar25;
    lVar32 = auVar87._8_8_ + auVar77._8_8_;
    uVar76 = lVar25 - lVar33;
    uVar79 = auVar77._8_8_ - auVar87._8_8_;
    lVar25 = lVar34 + lVar88;
    lVar33 = auVar89._8_8_ + auVar69._8_8_;
    uVar67 = lVar88 - lVar34;
    uVar72 = auVar69._8_8_ - auVar89._8_8_;
    lVar88 = lVar29 + lVar30;
    lVar34 = auVar59._8_8_ + auVar64._8_8_;
    uVar63 = lVar30 - lVar29;
    uVar66 = auVar64._8_8_ - auVar59._8_8_;
    lVar29 = lVar26 + lVar28;
    lVar30 = auVar81._8_8_ + auVar43._8_8_;
    uVar42 = lVar28 - lVar26;
    uVar44 = auVar43._8_8_ - auVar81._8_8_;
    uVar52 = *piVar1 - *piVar5;
    iVar56 = piVar1[1] - piVar5[1];
    uVar57 = piVar1[2] - piVar5[2];
    iVar58 = piVar1[3] - piVar5[3];
    auVar82._4_4_ = iVar58;
    auVar82._0_4_ = uVar57;
    uVar111 = *piVar2 - *piVar7;
    iVar114 = piVar2[1] - piVar7[1];
    uVar116 = piVar2[2] - piVar7[2];
    iVar117 = piVar2[3] - piVar7[3];
    uVar45 = -(uint)((int)uVar57 < 0);
    iVar74 = -(uint)(iVar58 < 0);
    local_f8 = CONCAT44(iVar74,uVar45);
    auVar82._8_4_ = iVar58;
    auVar82._12_4_ = iVar74;
    uVar83 = auVar82._8_8_;
    uVar103 = *piVar3 - *piVar8;
    iVar106 = piVar3[1] - piVar8[1];
    uVar107 = piVar3[2] - piVar8[2];
    iVar110 = piVar3[3] - piVar8[3];
    uVar90 = *piVar6 - *piVar9;
    iVar92 = piVar6[1] - piVar9[1];
    auVar48._4_4_ = iVar92;
    auVar48._0_4_ = uVar90;
    uVar93 = piVar6[2] - piVar9[2];
    iVar71 = piVar6[3] - piVar9[3];
    auVar96._4_4_ = iVar117;
    auVar96._0_4_ = uVar116;
    pDVar4 = data + lVar31 + 8;
    *pDVar4 = (DCTELEM)(lVar29 + lVar25 + 4U >> 3);
    pDVar4[1] = (DCTELEM)(lVar30 + lVar33 + 4U >> 3);
    pDVar4[2] = (DCTELEM)(lVar88 + lVar27 + 4U >> 3);
    pDVar4[3] = (DCTELEM)(lVar34 + lVar32 + 4U >> 3);
    uVar112 = -(uint)((int)uVar116 < 0);
    iVar115 = -(uint)(iVar117 < 0);
    auVar96._8_4_ = iVar117;
    auVar96._12_4_ = iVar115;
    uVar97 = auVar96._8_8_;
    auVar99._4_4_ = iVar110;
    auVar99._0_4_ = uVar107;
    pDVar4 = data + lVar31 + 0x28;
    *pDVar4 = (DCTELEM)((lVar25 - lVar29) + 4U >> 3);
    pDVar4[1] = (DCTELEM)((lVar33 - lVar30) + 4U >> 3);
    pDVar4[2] = (DCTELEM)((lVar27 - lVar88) + 4U >> 3);
    pDVar4[3] = (DCTELEM)((lVar32 - lVar34) + 4U >> 3);
    lVar28 = (uVar67 + uVar42 & 0xffffffff) * 0x1151 + 0x8000 +
             ((uVar67 + uVar42 >> 0x20) * 0x1151 << 0x20);
    lVar29 = (uVar72 + uVar44 & 0xffffffff) * 0x1151 + 0x8000 +
             ((uVar72 + uVar44 >> 0x20) * 0x1151 << 0x20);
    lVar30 = (uVar76 + uVar63 & 0xffffffff) * 0x1151 + 0x8000 +
             ((uVar76 + uVar63 >> 0x20) * 0x1151 << 0x20);
    lVar88 = (uVar79 + uVar66 & 0xffffffff) * 0x1151 + 0x8000 +
             ((uVar79 + uVar66 >> 0x20) * 0x1151 << 0x20);
    uVar46 = -(uint)((int)uVar107 < 0);
    iVar51 = -(uint)(iVar110 < 0);
    local_c8 = CONCAT44(iVar51,uVar46);
    auVar99._8_4_ = iVar110;
    auVar99._12_4_ = iVar51;
    uVar101 = auVar99._8_8_;
    pDVar4 = data + lVar31 + 0x18;
    *pDVar4 = (DCTELEM)(((uVar67 >> 0x20) * 0x187e << 0x20) + (uVar67 & 0xffffffff) * 0x187e +
                        lVar28 >> 0x10);
    pDVar4[1] = (DCTELEM)(((uVar72 >> 0x20) * 0x187e << 0x20) + (uVar72 & 0xffffffff) * 0x187e +
                          lVar29 >> 0x10);
    pDVar4[2] = (DCTELEM)(((uVar76 >> 0x20) * 0x187e << 0x20) + (uVar76 & 0xffffffff) * 0x187e +
                          lVar30 >> 0x10);
    pDVar4[3] = (DCTELEM)(((uVar79 >> 0x20) * 0x187e << 0x20) + (uVar79 & 0xffffffff) * 0x187e +
                          lVar88 >> 0x10);
    auVar85._4_4_ = iVar71;
    auVar85._0_4_ = uVar93;
    uVar47 = -(uint)((int)uVar93 < 0);
    iVar110 = -(uint)(iVar71 < 0);
    local_88 = CONCAT44(iVar110,uVar47);
    auVar85._8_4_ = iVar71;
    auVar85._12_4_ = iVar110;
    uVar86 = auVar85._8_8_;
    pDVar4 = data + lVar31 + 0x38;
    *pDVar4 = (DCTELEM)((uVar42 & 0xffffffff) * 0xffffc4df +
                        ((uVar42 >> 0x20) * 0xffffc4df + (uVar42 & 0xffffffff) * 0xffff << 0x20) +
                        lVar28 >> 0x10);
    pDVar4[1] = (DCTELEM)((uVar44 & 0xffffffff) * 0xffffc4df +
                          ((uVar44 >> 0x20) * 0xffffc4df + (uVar44 & 0xffffffff) * 0xffff << 0x20) +
                          lVar29 >> 0x10);
    pDVar4[2] = (DCTELEM)((uVar63 & 0xffffffff) * 0xffffc4df +
                          ((uVar63 >> 0x20) * 0xffffc4df + (uVar63 & 0xffffffff) * 0xffff << 0x20) +
                          lVar30 >> 0x10);
    pDVar4[3] = (DCTELEM)((uVar66 & 0xffffffff) * 0xffffc4df +
                          ((uVar66 >> 0x20) * 0xffffc4df + (uVar66 & 0xffffffff) * 0xffff << 0x20) +
                          lVar88 >> 0x10);
    uVar42 = CONCAT44(uVar46,uVar107) + CONCAT44(uVar45,uVar57);
    uVar44 = uVar101 + uVar83;
    uVar66 = CONCAT44(uVar47,uVar93) + CONCAT44(uVar112,uVar116);
    uVar67 = uVar86 + uVar97;
    lVar30 = ((uVar66 + uVar42 >> 0x20) * 0x25a1 << 0x20) + (uVar66 + uVar42 & 0xffffffff) * 0x25a1;
    lVar88 = ((uVar67 + uVar44 >> 0x20) * 0x25a1 << 0x20) + (uVar67 + uVar44 & 0xffffffff) * 0x25a1;
    auVar105._4_4_ = iVar56;
    auVar105._0_4_ = uVar52;
    uVar41 = -(uint)((int)uVar52 < 0);
    iVar71 = -(uint)(iVar56 < 0);
    auVar105._8_4_ = iVar56;
    auVar105._12_4_ = iVar71;
    uVar108 = auVar105._8_8_;
    auVar53._4_4_ = iVar114;
    auVar53._0_4_ = uVar111;
    uVar75 = -(uint)((int)uVar111 < 0);
    iVar78 = -(uint)(iVar114 < 0);
    auVar53._8_4_ = iVar114;
    auVar53._12_4_ = iVar78;
    uVar72 = auVar53._8_8_;
    auVar100._4_4_ = iVar106;
    auVar100._0_4_ = uVar103;
    uVar61 = -(uint)((int)uVar103 < 0);
    iVar56 = -(uint)(iVar106 < 0);
    local_d8 = CONCAT44(iVar56,uVar61);
    auVar100._8_4_ = iVar106;
    auVar100._12_4_ = iVar56;
    uVar102 = auVar100._8_8_;
    uVar62 = -(uint)((int)uVar90 < 0);
    iVar106 = -(uint)(iVar92 < 0);
    local_98 = CONCAT44(iVar106,uVar62);
    auVar48._8_4_ = iVar92;
    auVar48._12_4_ = iVar106;
    uVar63 = auVar48._8_8_;
    uVar68 = CONCAT44(uVar61,uVar103) + CONCAT44(uVar41,uVar52);
    uVar73 = uVar102 + uVar108;
    uVar91 = CONCAT44(uVar62,uVar90) + CONCAT44(uVar75,uVar111);
    uVar94 = uVar63 + uVar72;
    lVar28 = ((uVar91 + uVar68 >> 0x20) * 0x25a1 << 0x20) + (uVar91 + uVar68 & 0xffffffff) * 0x25a1;
    lVar29 = ((uVar94 + uVar73 >> 0x20) * 0x25a1 << 0x20) + (uVar94 + uVar73 & 0xffffffff) * 0x25a1;
    uVar104 = CONCAT44(uVar47,uVar93) + CONCAT44(uVar45,uVar57);
    uVar109 = uVar86 + uVar83;
    auVar65._8_4_ = iVar74;
    auVar65._0_8_ = local_f8;
    auVar65._12_4_ = iVar74;
    uVar80 = CONCAT44(uVar62,uVar90) + CONCAT44(uVar41,uVar52);
    uVar84 = uVar63 + uVar108;
    auVar70._4_4_ = iVar71;
    auVar70._0_4_ = uVar41;
    auVar70._8_4_ = iVar71;
    auVar70._12_4_ = -(uint)(iVar58 < 0);
    uVar76 = CONCAT44(uVar46,uVar107) + CONCAT44(uVar112,uVar116);
    uVar79 = uVar101 + uVar97;
    auVar60._4_4_ = iVar115;
    auVar60._0_4_ = uVar112;
    auVar60._8_4_ = iVar115;
    auVar60._12_4_ = -(uint)(iVar117 < 0);
    uVar95 = CONCAT44(uVar61,uVar103) + CONCAT44(uVar75,uVar111);
    uVar98 = uVar102 + uVar72;
    auVar113._4_4_ = iVar78;
    auVar113._0_4_ = uVar75;
    auVar113._8_4_ = iVar78;
    auVar113._12_4_ = -(uint)(iVar117 < 0);
    auVar54._8_4_ = iVar51;
    auVar54._0_8_ = local_c8;
    auVar54._12_4_ = iVar51;
    auVar55._8_4_ = iVar56;
    auVar55._0_8_ = local_d8;
    auVar55._12_4_ = iVar56;
    auVar49._8_4_ = iVar110;
    auVar49._0_8_ = local_88;
    auVar49._12_4_ = iVar110;
    auVar50._8_4_ = iVar106;
    auVar50._0_8_ = local_98;
    auVar50._12_4_ = iVar106;
    lVar37 = (uVar68 & 0xffffffff) * 0xfffff384 +
             ((uVar68 >> 0x20) * 0xfffff384 + (uVar68 & 0xffffffff) * 0xffffffff << 0x20) + lVar28;
    lVar38 = (uVar73 & 0xffffffff) * 0xfffff384 +
             ((uVar73 >> 0x20) * 0xfffff384 + (uVar73 & 0xffffffff) * 0xffffffff << 0x20) + lVar29;
    lVar28 = (uVar91 & 0xffffffff) * 0xffffc13b +
             ((uVar91 >> 0x20) * 0xffffc13b + (uVar91 & 0xffffffff) * 0xffffffff << 0x20) + lVar28;
    lVar29 = (uVar94 & 0xffffffff) * 0xffffc13b +
             ((uVar94 >> 0x20) * 0xffffc13b + (uVar94 & 0xffffffff) * 0xffffffff << 0x20) + lVar29;
    lVar33 = (uVar42 & 0xffffffff) * 0xfffff384 +
             ((uVar42 >> 0x20) * 0xfffff384 + (uVar42 & 0xffffffff) * 0xffffffff << 0x20) + lVar30;
    lVar34 = (uVar44 & 0xffffffff) * 0xfffff384 +
             ((uVar44 >> 0x20) * 0xfffff384 + (uVar44 & 0xffffffff) * 0xffffffff << 0x20) + lVar88;
    lVar30 = (uVar66 & 0xffffffff) * 0xffffc13b +
             ((uVar66 >> 0x20) * 0xffffc13b + (uVar66 & 0xffffffff) * 0xffffffff << 0x20) + lVar30;
    lVar88 = (uVar67 & 0xffffffff) * 0xffffc13b +
             ((uVar67 >> 0x20) * 0xffffc13b + (uVar67 & 0xffffffff) * 0xffffffff << 0x20) + lVar88;
    lVar39 = (uVar104 & 0xffffffff) * 0xffffe333 + 0x8000 +
             ((uVar104 >> 0x20) * 0xffffe333 + (uVar104 & 0xffffffff) * 0xffffffff << 0x20);
    lVar40 = (uVar109 & 0xffffffff) * 0xffffe333 + 0x8000 +
             ((uVar109 >> 0x20) * 0xffffe333 + (uVar109 & 0xffffffff) * 0xffffffff << 0x20);
    lVar27 = (uVar80 & 0xffffffff) * 0xffffe333 + 0x8000 +
             ((uVar80 >> 0x20) * 0xffffe333 + (uVar80 & 0xffffffff) * 0xffffffff << 0x20);
    lVar32 = (uVar84 & 0xffffffff) * 0xffffe333 + 0x8000 +
             ((uVar84 >> 0x20) * 0xffffe333 + (uVar84 & 0xffffffff) * 0xffffffff << 0x20);
    pDVar4 = data + lVar31 + 0x10;
    *pDVar4 = (DCTELEM)(((ulong)uVar41 * 0x300b << 0x20) + (ulong)uVar52 * 0x300b + lVar27 + lVar37
                       >> 0x10);
    pDVar4[1] = (DCTELEM)(((auVar70._8_8_ & 0xffffffff) * 0x300b << 0x20) +
                          (uVar108 & 0xffffffff) * 0x300b + lVar32 + lVar38 >> 0x10);
    pDVar4[2] = (DCTELEM)(((ulong)uVar45 * 0x300b << 0x20) + (ulong)uVar57 * 0x300b + lVar39 +
                          lVar33 >> 0x10);
    pDVar4[3] = (DCTELEM)(((auVar65._8_8_ & 0xffffffff) * 0x300b << 0x20) +
                          (uVar83 & 0xffffffff) * 0x300b + lVar40 + lVar34 >> 0x10);
    lVar25 = (uVar76 & 0xffffffff) * 0xffffadfd + 0x8000 +
             ((uVar76 >> 0x20) * 0xffffadfd + (uVar76 & 0xffffffff) * 0xffffffff << 0x20);
    lVar26 = (uVar79 & 0xffffffff) * 0xffffadfd + 0x8000 +
             ((uVar79 >> 0x20) * 0xffffadfd + (uVar79 & 0xffffffff) * 0xffffffff << 0x20);
    lVar35 = (uVar95 & 0xffffffff) * 0xffffadfd + 0x8000 +
             ((uVar95 >> 0x20) * 0xffffadfd + (uVar95 & 0xffffffff) * 0xffffffff << 0x20);
    lVar36 = (uVar98 & 0xffffffff) * 0xffffadfd + 0x8000 +
             ((uVar98 >> 0x20) * 0xffffadfd + (uVar98 & 0xffffffff) * 0xffffffff << 0x20);
    pDVar4 = data + lVar31 + 0x20;
    *pDVar4 = (DCTELEM)(((ulong)uVar75 * 0x6254 << 0x20) + (ulong)uVar111 * 0x6254 + lVar35 + lVar28
                       >> 0x10);
    pDVar4[1] = (DCTELEM)(((auVar113._8_8_ & 0xffffffff) * 0x6254 << 0x20) +
                          (uVar72 & 0xffffffff) * 0x6254 + lVar36 + lVar29 >> 0x10);
    pDVar4[2] = (DCTELEM)(((ulong)uVar112 * 0x6254 << 0x20) + (ulong)uVar116 * 0x6254 + lVar25 +
                          lVar30 >> 0x10);
    pDVar4[3] = (DCTELEM)(((auVar60._8_8_ & 0xffffffff) * 0x6254 << 0x20) +
                          (uVar97 & 0xffffffff) * 0x6254 + lVar26 + lVar88 >> 0x10);
    pDVar4 = data + lVar31 + 0x30;
    *pDVar4 = (DCTELEM)(lVar35 + ((ulong)uVar61 * 0x41b3 << 0x20) + (ulong)uVar103 * 0x41b3 + lVar37
                       >> 0x10);
    pDVar4[1] = (DCTELEM)(lVar36 + ((auVar55._8_8_ & 0xffffffff) * 0x41b3 << 0x20) +
                                   (uVar102 & 0xffffffff) * 0x41b3 + lVar38 >> 0x10);
    pDVar4[2] = (DCTELEM)(lVar25 + ((ulong)uVar46 * 0x41b3 << 0x20) + (ulong)uVar107 * 0x41b3 +
                          lVar33 >> 0x10);
    pDVar4[3] = (DCTELEM)(lVar26 + ((auVar54._8_8_ & 0xffffffff) * 0x41b3 << 0x20) +
                                   (uVar101 & 0xffffffff) * 0x41b3 + lVar34 >> 0x10);
    pDVar4 = data + lVar31 + 0x40;
    *pDVar4 = (DCTELEM)(lVar27 + ((ulong)uVar62 * 0x98e << 0x20) + (ulong)uVar90 * 0x98e + lVar28 >>
                       0x10);
    pDVar4[1] = (DCTELEM)(lVar32 + ((auVar50._8_8_ & 0xffffffff) * 0x98e << 0x20) +
                                   (uVar63 & 0xffffffff) * 0x98e + lVar29 >> 0x10);
    pDVar4[2] = (DCTELEM)(lVar39 + ((ulong)uVar47 * 0x98e << 0x20) + (ulong)uVar93 * 0x98e + lVar30
                         >> 0x10);
    pDVar4[3] = (DCTELEM)(lVar40 + ((auVar49._8_8_ & 0xffffffff) * 0x98e << 0x20) +
                                   (uVar86 & 0xffffffff) * 0x98e + lVar88 >> 0x10);
    lVar31 = lVar31 + 4;
  } while (lVar31 != 0);
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_16x8 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1, tmp2, tmp3, tmp4, tmp5, tmp6, tmp7;
  INT32 tmp10, tmp11, tmp12, tmp13, tmp14, tmp15, tmp16, tmp17;
  INT32 z1;
  DCTELEM *dataptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT; */
  /* furthermore, we scale the results by 2**PASS1_BITS. */
  /* 16-point FDCT kernel, cK represents sqrt(2) * cos(K*pi/32). */

  dataptr = data;
  ctr = 0;
  for (ctr = 0; ctr < DCTSIZE; ctr++) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[15]);
    tmp1 = GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[14]);
    tmp2 = GETJSAMPLE(elemptr[2]) + GETJSAMPLE(elemptr[13]);
    tmp3 = GETJSAMPLE(elemptr[3]) + GETJSAMPLE(elemptr[12]);
    tmp4 = GETJSAMPLE(elemptr[4]) + GETJSAMPLE(elemptr[11]);
    tmp5 = GETJSAMPLE(elemptr[5]) + GETJSAMPLE(elemptr[10]);
    tmp6 = GETJSAMPLE(elemptr[6]) + GETJSAMPLE(elemptr[9]);
    tmp7 = GETJSAMPLE(elemptr[7]) + GETJSAMPLE(elemptr[8]);

    tmp10 = tmp0 + tmp7;
    tmp14 = tmp0 - tmp7;
    tmp11 = tmp1 + tmp6;
    tmp15 = tmp1 - tmp6;
    tmp12 = tmp2 + tmp5;
    tmp16 = tmp2 - tmp5;
    tmp13 = tmp3 + tmp4;
    tmp17 = tmp3 - tmp4;

    tmp0 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[15]);
    tmp1 = GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[14]);
    tmp2 = GETJSAMPLE(elemptr[2]) - GETJSAMPLE(elemptr[13]);
    tmp3 = GETJSAMPLE(elemptr[3]) - GETJSAMPLE(elemptr[12]);
    tmp4 = GETJSAMPLE(elemptr[4]) - GETJSAMPLE(elemptr[11]);
    tmp5 = GETJSAMPLE(elemptr[5]) - GETJSAMPLE(elemptr[10]);
    tmp6 = GETJSAMPLE(elemptr[6]) - GETJSAMPLE(elemptr[9]);
    tmp7 = GETJSAMPLE(elemptr[7]) - GETJSAMPLE(elemptr[8]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM)
      ((tmp10 + tmp11 + tmp12 + tmp13 - 16 * CENTERJSAMPLE) << PASS1_BITS);
    dataptr[4] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 - tmp13, FIX(1.306562965)) + /* c4[16] = c2[8] */
	      MULTIPLY(tmp11 - tmp12, FIX_0_541196100),   /* c12[16] = c6[8] */
	      CONST_BITS-PASS1_BITS);

    tmp10 = MULTIPLY(tmp17 - tmp15, FIX(0.275899379)) +   /* c14[16] = c7[8] */
	    MULTIPLY(tmp14 - tmp16, FIX(1.387039845));    /* c2[16] = c1[8] */

    dataptr[2] = (DCTELEM)
      DESCALE(tmp10 + MULTIPLY(tmp15, FIX(1.451774982))   /* c6+c14 */
	      + MULTIPLY(tmp16, FIX(2.172734804)),        /* c2+c10 */
	      CONST_BITS-PASS1_BITS);
    dataptr[6] = (DCTELEM)
      DESCALE(tmp10 - MULTIPLY(tmp14, FIX(0.211164243))   /* c2-c6 */
	      - MULTIPLY(tmp17, FIX(1.061594338)),        /* c10+c14 */
	      CONST_BITS-PASS1_BITS);

    /* Odd part */

    tmp11 = MULTIPLY(tmp0 + tmp1, FIX(1.353318001)) +         /* c3 */
	    MULTIPLY(tmp6 - tmp7, FIX(0.410524528));          /* c13 */
    tmp12 = MULTIPLY(tmp0 + tmp2, FIX(1.247225013)) +         /* c5 */
	    MULTIPLY(tmp5 + tmp7, FIX(0.666655658));          /* c11 */
    tmp13 = MULTIPLY(tmp0 + tmp3, FIX(1.093201867)) +         /* c7 */
	    MULTIPLY(tmp4 - tmp7, FIX(0.897167586));          /* c9 */
    tmp14 = MULTIPLY(tmp1 + tmp2, FIX(0.138617169)) +         /* c15 */
	    MULTIPLY(tmp6 - tmp5, FIX(1.407403738));          /* c1 */
    tmp15 = MULTIPLY(tmp1 + tmp3, - FIX(0.666655658)) +       /* -c11 */
	    MULTIPLY(tmp4 + tmp6, - FIX(1.247225013));        /* -c5 */
    tmp16 = MULTIPLY(tmp2 + tmp3, - FIX(1.353318001)) +       /* -c3 */
	    MULTIPLY(tmp5 - tmp4, FIX(0.410524528));          /* c13 */
    tmp10 = tmp11 + tmp12 + tmp13 -
	    MULTIPLY(tmp0, FIX(2.286341144)) +                /* c7+c5+c3-c1 */
	    MULTIPLY(tmp7, FIX(0.779653625));                 /* c15+c13-c11+c9 */
    tmp11 += tmp14 + tmp15 + MULTIPLY(tmp1, FIX(0.071888074)) /* c9-c3-c15+c11 */
	     - MULTIPLY(tmp6, FIX(1.663905119));              /* c7+c13+c1-c5 */
    tmp12 += tmp14 + tmp16 - MULTIPLY(tmp2, FIX(1.125726048)) /* c7+c5+c15-c3 */
	     + MULTIPLY(tmp5, FIX(1.227391138));              /* c9-c11+c1-c13 */
    tmp13 += tmp15 + tmp16 + MULTIPLY(tmp3, FIX(1.065388962)) /* c15+c3+c11-c7 */
	     + MULTIPLY(tmp4, FIX(2.167985692));              /* c1+c13+c5-c9 */

    dataptr[1] = (DCTELEM) DESCALE(tmp10, CONST_BITS-PASS1_BITS);
    dataptr[3] = (DCTELEM) DESCALE(tmp11, CONST_BITS-PASS1_BITS);
    dataptr[5] = (DCTELEM) DESCALE(tmp12, CONST_BITS-PASS1_BITS);
    dataptr[7] = (DCTELEM) DESCALE(tmp13, CONST_BITS-PASS1_BITS);

    dataptr += DCTSIZE;		/* advance pointer to next row */
  }

  /* Pass 2: process columns.
   * We remove the PASS1_BITS scaling, but leave the results scaled up
   * by an overall factor of 8.
   * We must also scale the output by 8/16 = 1/2.
   */

  dataptr = data;
  for (ctr = DCTSIZE-1; ctr >= 0; ctr--) {
    /* Even part per LL&M figure 1 --- note that published figure is faulty;
     * rotator "sqrt(2)*c1" should be "sqrt(2)*c6".
     */

    tmp0 = dataptr[DCTSIZE*0] + dataptr[DCTSIZE*7];
    tmp1 = dataptr[DCTSIZE*1] + dataptr[DCTSIZE*6];
    tmp2 = dataptr[DCTSIZE*2] + dataptr[DCTSIZE*5];
    tmp3 = dataptr[DCTSIZE*3] + dataptr[DCTSIZE*4];

    tmp10 = tmp0 + tmp3;
    tmp12 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp13 = tmp1 - tmp2;

    tmp0 = dataptr[DCTSIZE*0] - dataptr[DCTSIZE*7];
    tmp1 = dataptr[DCTSIZE*1] - dataptr[DCTSIZE*6];
    tmp2 = dataptr[DCTSIZE*2] - dataptr[DCTSIZE*5];
    tmp3 = dataptr[DCTSIZE*3] - dataptr[DCTSIZE*4];

    dataptr[DCTSIZE*0] = (DCTELEM) DESCALE(tmp10 + tmp11, PASS1_BITS+1);
    dataptr[DCTSIZE*4] = (DCTELEM) DESCALE(tmp10 - tmp11, PASS1_BITS+1);

    z1 = MULTIPLY(tmp12 + tmp13, FIX_0_541196100);
    dataptr[DCTSIZE*2] = (DCTELEM) DESCALE(z1 + MULTIPLY(tmp12, FIX_0_765366865),
					   CONST_BITS+PASS1_BITS+1);
    dataptr[DCTSIZE*6] = (DCTELEM) DESCALE(z1 - MULTIPLY(tmp13, FIX_1_847759065),
					   CONST_BITS+PASS1_BITS+1);

    /* Odd part per figure 8 --- note paper omits factor of sqrt(2).
     * 8-point FDCT kernel, cK represents sqrt(2) * cos(K*pi/16).
     * i0..i3 in the paper are tmp0..tmp3 here.
     */

    tmp10 = tmp0 + tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp0 + tmp2;
    tmp13 = tmp1 + tmp3;
    z1 = MULTIPLY(tmp12 + tmp13, FIX_1_175875602); /*  c3 */

    tmp0  = MULTIPLY(tmp0,    FIX_1_501321110);    /*  c1+c3-c5-c7 */
    tmp1  = MULTIPLY(tmp1,    FIX_3_072711026);    /*  c1+c3+c5-c7 */
    tmp2  = MULTIPLY(tmp2,    FIX_2_053119869);    /*  c1+c3-c5+c7 */
    tmp3  = MULTIPLY(tmp3,    FIX_0_298631336);    /* -c1+c3+c5-c7 */
    tmp10 = MULTIPLY(tmp10, - FIX_0_899976223);    /*  c7-c3 */
    tmp11 = MULTIPLY(tmp11, - FIX_2_562915447);    /* -c1-c3 */
    tmp12 = MULTIPLY(tmp12, - FIX_0_390180644);    /*  c5-c3 */
    tmp13 = MULTIPLY(tmp13, - FIX_1_961570560);    /* -c3-c5 */

    tmp12 += z1;
    tmp13 += z1;

    dataptr[DCTSIZE*1] = (DCTELEM) DESCALE(tmp0 + tmp10 + tmp12,
					   CONST_BITS+PASS1_BITS+1);
    dataptr[DCTSIZE*3] = (DCTELEM) DESCALE(tmp1 + tmp11 + tmp13,
					   CONST_BITS+PASS1_BITS+1);
    dataptr[DCTSIZE*5] = (DCTELEM) DESCALE(tmp2 + tmp11 + tmp12,
					   CONST_BITS+PASS1_BITS+1);
    dataptr[DCTSIZE*7] = (DCTELEM) DESCALE(tmp3 + tmp10 + tmp13,
					   CONST_BITS+PASS1_BITS+1);

    dataptr++;			/* advance pointer to next column */
  }
}